

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractanimation_p.cpp
# Opt level: O0

int __thiscall QAnimationTimer::qt_metacall(QAnimationTimer *this,Call _c,int _id,void **_a)

{
  QObject *in_RCX;
  int in_ESI;
  undefined8 in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffb8;
  Call in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_28;
  QMetaType local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = QAbstractAnimationTimer::qt_metacall
                       ((QAbstractAnimationTimer *)
                        CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,(void **)0x66d194);
  if (-1 < local_28) {
    if (in_ESI == 0) {
      if (local_28 < 2) {
        qt_static_metacall(in_RCX,(Call)((ulong)in_RDI >> 0x20),(int)in_RDI,
                           (void **)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      }
      local_28 = local_28 + -2;
    }
    if (in_ESI == 7) {
      if (local_28 < 2) {
        memset(&local_10,0,8);
        QMetaType::QMetaType(&local_10);
        *in_RCX->_vptr_QObject = (_func_int *)local_10.d_ptr;
      }
      local_28 = local_28 + -2;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

int QAnimationTimer::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QAbstractAnimationTimer::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 2)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 2;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 2)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 2;
    }
    return _id;
}